

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O1

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::
emplace<llvm::DWARFDebugNames::Entry>
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,Entry *args)

{
  void *__ptr;
  Abbrev *pAVar1;
  
  if (this->hasVal == true) {
    (this->field_0).value.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
    __ptr = (this->field_0).value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
            super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX
    ;
    if (__ptr != (void *)((long)&this->field_0 + 0x18)) {
      free(__ptr);
    }
    this->hasVal = false;
  }
  (this->field_0).value.super_Entry._vptr_Entry = (_func_int **)&PTR___cxa_pure_virtual_01097f30;
  SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
            (&(this->field_0).value.super_Entry.Values,&(args->super_Entry).Values);
  (this->field_0).value.super_Entry._vptr_Entry = (_func_int **)&PTR_getCUOffset_01097e30;
  pAVar1 = args->Abbr;
  (this->field_0).value.NameIdx = args->NameIdx;
  (this->field_0).value.Abbr = pAVar1;
  this->hasVal = true;
  return;
}

Assistant:

void emplace(Args &&... args) {
    reset();
    ::new ((void *)std::addressof(value)) T(std::forward<Args>(args)...);
    hasVal = true;
  }